

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# named_fstream.cc
# Opt level: O3

void __thiscall named_fstream::~named_fstream(named_fstream *this)

{
  ~named_fstream(this,&VTT);
  std::ios_base::~ios_base((ios_base *)&(this->super_fstream).field_0x140);
  return;
}

Assistant:

named_fstream::~named_fstream() {
    remove(file_name.data());
}